

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

int __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>_>::copy
          (TypedAttribute<Imath_3_2::Vec3<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _func_int **pp_Var1;
  Attribute *this_00;
  TypedAttribute<Imath_3_2::Vec3<double>_> *pTVar2;
  
  this_00 = (Attribute *)operator_new(0x20);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e4760;
  pTVar2 = cast(&this->super_Attribute);
  pp_Var1 = (_func_int **)(pTVar2->_value).y;
  this_00[1]._vptr_Attribute = (_func_int **)(pTVar2->_value).x;
  this_00[2]._vptr_Attribute = pp_Var1;
  this_00[3]._vptr_Attribute = (_func_int **)(pTVar2->_value).z;
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}